

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

_Bool ext_ml_model_decision_before_none_part2
                (AV1_COMP *cpi,float *features_from_motion,int *prune_horz,int *prune_vert)

{
  _Bool _Var1;
  long lVar2;
  float *pfVar3;
  aom_partition_features_t features;
  aom_partition_decision_t decision;
  aom_partition_features_t local_2b58;
  aom_partition_decision_t local_205c;
  
  if ((cpi->ext_part_controller).ready != 0) {
    local_2b58.id = AOM_EXT_PART_FEATURE_BEFORE_NONE_PART2;
    pfVar3 = local_2b58.before_part_none.f_part2;
    for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pfVar3 = *features_from_motion;
      features_from_motion = features_from_motion + 1;
      pfVar3 = pfVar3 + 1;
    }
    av1_ext_part_send_features(&cpi->ext_part_controller,&local_2b58);
    _Var1 = av1_ext_part_get_partition_decision(&cpi->ext_part_controller,&local_205c);
    if (_Var1) {
      *prune_horz = local_205c.prune_rect_part[0];
      *prune_vert = local_205c.prune_rect_part[1];
    }
    return _Var1;
  }
  return false;
}

Assistant:

static bool ext_ml_model_decision_before_none_part2(
    AV1_COMP *cpi,
    const float features_from_motion[FEATURE_SIZE_SMS_PRUNE_PART],
    int *prune_horz, int *prune_vert) {
  ExtPartController *const ext_part_controller = &cpi->ext_part_controller;
  if (!ext_part_controller->ready) return false;

  // Setup features.
  aom_partition_features_t features;
  features.id = AOM_EXT_PART_FEATURE_BEFORE_NONE_PART2;
  for (int i = 0; i < FEATURE_SIZE_SMS_PRUNE_PART; ++i) {
    features.before_part_none.f_part2[i] = features_from_motion[i];
  }

  // Send necessary features to the external model.
  av1_ext_part_send_features(ext_part_controller, &features);

  // Get partition decisions from the external model.
  aom_partition_decision_t decision;
  const bool valid_decision =
      av1_ext_part_get_partition_decision(ext_part_controller, &decision);
  if (!valid_decision) return false;

  // Populate decisions
  *prune_horz = decision.prune_rect_part[HORZ];
  *prune_vert = decision.prune_rect_part[VERT];

  return true;
}